

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O0

bool __thiscall ON_MeshParameters::Write(ON_MeshParameters *this,ON_BinaryArchive *file)

{
  undefined1 local_68 [8];
  ON_SubDDisplayParameters subdp;
  bool local_1d;
  int mft;
  bool rc;
  int minor_version;
  ON_BinaryArchive *file_local;
  ON_MeshParameters *this_local;
  
  local_1d = ON_BinaryArchive::Write3dmChunkVersion(file,1,5);
  if (local_1d) {
    if (local_1d) {
      local_1d = ON_BinaryArchive::WriteInt(file,(uint)(this->m_bComputeCurvature & 1));
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteInt(file,(uint)(this->m_bSimplePlanes & 1));
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteInt(file,(uint)(this->m_bRefine & 1));
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteInt(file,(uint)(this->m_bJaggedSeams & 1));
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteInt(file,0);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_tolerance);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_min_edge_length);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_max_edge_length);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_grid_aspect_ratio);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteInt(file,this->m_grid_min_count);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteInt(file,this->m_grid_max_count);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_grid_angle_radians);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_grid_amplification);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_refine_angle_radians);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,0.08726646259971647);
    }
    subdp.m_progress_reporter_interval.m_t[1]._4_4_ = (uint)this->m_face_type;
    if (2 < subdp.m_progress_reporter_interval.m_t[1]._4_4_) {
      ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                 ,0x1e67,"","ON_MeshParameters::Write() - m_face_type out of bounds.");
      subdp.m_progress_reporter_interval.m_t[1]._4_4_ = 0;
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteInt(file,subdp.m_progress_reporter_interval.m_t[1]._4_4_);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteInt(file,(uint)this->m_texture_range);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteBool(file,(bool)(this->m_bCustomSettings & 1));
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteDouble(file,this->m_relative_tolerance);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteChar(file,this->m_mesher);
    }
    if (local_1d != false) {
      local_1d = ON_BinaryArchive::WriteBool(file,(bool)(this->m_bCustomSettingsEnabled & 1));
    }
    if (local_1d != false) {
      SubDDisplayParameters((ON_SubDDisplayParameters *)local_68,this);
      local_1d = ON_SubDDisplayParameters::Write((ON_SubDDisplayParameters *)local_68,file);
    }
  }
  return local_1d;
}

Assistant:

bool ON_MeshParameters::Write( ON_BinaryArchive& file ) const
{
  int minor_version = 5; 
  bool rc = file.Write3dmChunkVersion(1,minor_version);
  if (rc) 
  {
    if (rc) rc = file.WriteInt(m_bComputeCurvature);
    if (rc) rc = file.WriteInt(m_bSimplePlanes);
    if (rc) rc = file.WriteInt(m_bRefine);
    if (rc) rc = file.WriteInt(m_bJaggedSeams);
    if (rc) rc = file.WriteInt(0); // obsolete m_bWeld field
    if (rc) rc = file.WriteDouble(m_tolerance);
    if (rc) rc = file.WriteDouble(m_min_edge_length);
    if (rc) rc = file.WriteDouble(m_max_edge_length);
    if (rc) rc = file.WriteDouble(m_grid_aspect_ratio);
    if (rc) rc = file.WriteInt(m_grid_min_count);
    if (rc) rc = file.WriteInt(m_grid_max_count);
    if (rc) rc = file.WriteDouble(m_grid_angle_radians);
    if (rc) rc = file.WriteDouble(m_grid_amplification);
    if (rc) rc = file.WriteDouble(m_refine_angle_radians);
    if (rc) rc = file.WriteDouble(5.0*ON_PI/180.0); // obsolete m_combine_angle field
    int mft = m_face_type;
    if ( mft < 0 || mft > 2 ) 
    {
      ON_ERROR("ON_MeshParameters::Write() - m_face_type out of bounds.");
      mft = 0;
    }
    if (rc) rc = file.WriteInt(mft);

    // added for chunk version 1.1
    if (rc) rc = file.WriteInt( m_texture_range );

    // added for chunk version 1.2 - 14 October 2005
    if (rc) rc = file.WriteBool( m_bCustomSettings );
    if (rc) rc = file.WriteDouble( m_relative_tolerance );
    // DO NOT SAVE m_min_tolerance - yet ??

    // added for chunk version 1.3 - 20 February 2006
    if (rc) rc = file.WriteChar(m_mesher);

    // added for chunk version 1.4 - 3 March 2011
    if (rc) rc = file.WriteBool( m_bCustomSettingsEnabled );

    if (rc)
    {
      // added for chunk version 1.5 - June 19, 2020
      const ON_SubDDisplayParameters subdp = SubDDisplayParameters();
      rc = subdp.Write(file);
    }
  }
  return rc;
}